

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

shared_ptr<kratos::Stmt> __thiscall
kratos::RemoveEmptyBlockVisitor::dispatch_node
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::Stmt> *stmt)

{
  int iVar1;
  _Atomic_word _Var2;
  _Atomic_word _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<kratos::SwitchStmt> sVar4;
  shared_ptr<kratos::StmtBlock> sVar5;
  shared_ptr<kratos::IfStmt> sVar6;
  shared_ptr<kratos::Stmt> sVar7;
  _func_int **local_20;
  uint32_t local_18;
  undefined4 uStack_14;
  
  iVar1 = *(int *)((in_RDX._M_pi)->_vptr__Sp_counted_base + 0xf);
  if (iVar1 == 4) {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDX._M_pi)->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar5 = process((RemoveEmptyBlockVisitor *)&stack0xffffffffffffffe0,
                    (shared_ptr<kratos::StmtBlock> *)stmt);
    in_RDX = sVar5.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = local_20;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    (this->super_IRVisitor).level = local_18;
    *(undefined4 *)&(this->super_IRVisitor).field_0xc = uStack_14;
  }
  else if (iVar1 == 1) {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDX._M_pi)->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar4 = process((RemoveEmptyBlockVisitor *)&stack0xffffffffffffffe0,
                    (shared_ptr<kratos::SwitchStmt> *)stmt);
    in_RDX = sVar4.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = local_20;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    (this->super_IRVisitor).level = local_18;
    *(undefined4 *)&(this->super_IRVisitor).field_0xc = uStack_14;
  }
  else {
    if (iVar1 != 0) {
      (this->super_IRVisitor)._vptr_IRVisitor = (in_RDX._M_pi)->_vptr__Sp_counted_base;
      *(undefined8 *)&(this->super_IRVisitor).level = 0;
      _Var2 = (in_RDX._M_pi)->_M_use_count;
      _Var3 = (in_RDX._M_pi)->_M_weak_count;
      (in_RDX._M_pi)->_M_use_count = 0;
      (in_RDX._M_pi)->_M_weak_count = 0;
      (this->super_IRVisitor).level = _Var2;
      *(_Atomic_word *)&(this->super_IRVisitor).field_0xc = _Var3;
      (in_RDX._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      goto LAB_0022d3e3;
    }
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDX._M_pi)->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar6 = process((RemoveEmptyBlockVisitor *)&stack0xffffffffffffffe0,
                    (shared_ptr<kratos::IfStmt> *)stmt);
    in_RDX = sVar6.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = local_20;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    (this->super_IRVisitor).level = local_18;
    *(undefined4 *)&(this->super_IRVisitor).field_0xc = uStack_14;
  }
  local_18 = 0;
  uStack_14 = 0;
  local_20 = (_func_int **)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
LAB_0022d3e3:
  sVar7.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar7.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar7.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> dispatch_node(std::shared_ptr<Stmt> stmt) {
        if (stmt->type() == StatementType::If) {
            return process(std::static_pointer_cast<IfStmt>(stmt));
        } else if (stmt->type() == StatementType::Switch) {
            return process(std::static_pointer_cast<SwitchStmt>(stmt));
        } else if (stmt->type() == StatementType::Block) {
            return process(std::static_pointer_cast<ScopedStmtBlock>(stmt));
        } else {
            return stmt;
        }
    }